

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_size(Curl_easy *data)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  curl_trc_feat *pcVar4;
  CURLcode CVar5;
  
  uVar1 = *(uint *)&(data->req).field_0xd9;
  if ((uVar1 & 0x5000) == 0) {
    lVar2 = (data->req).size;
    CVar5 = CURLE_OK;
    if (lVar2 != -1) {
      lVar3 = (data->set).max_filesize;
      if (((lVar3 < lVar2) && ((uVar1 & 0x400) == 0)) && (lVar3 != 0)) {
        Curl_failf(data,"Maximum file size exceeded");
        CVar5 = CURLE_FILESIZE_EXCEEDED;
      }
      else {
        if (((data != (Curl_easy *)0x0 && (uVar1 >> 10 & 1) != 0) &&
            (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"setting size while ignoring");
        }
        Curl_pgrsSetDownloadSize(data,(data->req).size);
        (data->req).maxdownload = (data->req).size;
      }
    }
  }
  else {
    *(undefined4 *)&(data->req).size = 0xffffffff;
    *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
    *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
    *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http_size(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  if(data->req.ignore_cl || k->chunk) {
    k->size = k->maxdownload = -1;
  }
  else if(k->size != -1) {
    if(data->set.max_filesize &&
       !k->ignorebody &&
       (k->size > data->set.max_filesize)) {
      failf(data, "Maximum file size exceeded");
      return CURLE_FILESIZE_EXCEEDED;
    }
    if(k->ignorebody)
      infof(data, "setting size while ignoring");
    Curl_pgrsSetDownloadSize(data, k->size);
    k->maxdownload = k->size;
  }
  return CURLE_OK;
}